

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

uint32_t llama_sampler_get_seed(llama_sampler *smpl)

{
  bool bVar1;
  long *in_RDI;
  uint32_t seed;
  const_reverse_iterator it;
  llama_sampler_chain *ctx;
  reverse_iterator<__gnu_cxx::__normal_iterator<llama_sampler_*const_*,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>_>
  *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  vector<llama_sampler_*,_std::allocator<llama_sampler_*>_> *in_stack_ffffffffffffffd8;
  llama_sampler *smpl_00;
  uint32_t local_4;
  
  if ((llama_sampler_i *)*in_RDI == &llama_sampler_dist_i) {
    local_4 = *(uint32_t *)(in_RDI[1] + 4);
  }
  else if ((llama_sampler_i *)*in_RDI == &llama_sampler_mirostat_i) {
    local_4 = *(uint32_t *)(in_RDI[1] + 8);
  }
  else if ((llama_sampler_i *)*in_RDI == &llama_sampler_mirostat_v2_i) {
    local_4 = *(uint32_t *)(in_RDI[1] + 4);
  }
  else {
    if ((llama_sampler_i *)*in_RDI == &llama_sampler_chain_i) {
      smpl_00 = (llama_sampler *)in_RDI[1];
      std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>::rbegin
                (in_stack_ffffffffffffffd8);
      while( true ) {
        std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>::rend
                  (in_stack_ffffffffffffffd8);
        bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<llama_sampler_*const_*,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                in_stack_ffffffffffffffc8);
        if (!bVar1) break;
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<llama_sampler_*const_*,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>_>
        ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<llama_sampler_*const_*,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>_>
                     *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        in_stack_ffffffffffffffd4 = llama_sampler_get_seed(smpl_00);
        if (in_stack_ffffffffffffffd4 != 0xffffffff) {
          return in_stack_ffffffffffffffd4;
        }
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<llama_sampler_*const_*,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<llama_sampler_*const_*,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>_>
                      *)CONCAT44(0xffffffff,in_stack_ffffffffffffffd0));
      }
    }
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

uint32_t llama_sampler_get_seed(const struct llama_sampler * smpl) {
    if (smpl->iface == &llama_sampler_dist_i) {
        return ((const llama_sampler_dist *) smpl->ctx)->seed_cur;
    }

    if (smpl->iface == &llama_sampler_mirostat_i) {
        return ((const llama_sampler_mirostat *) smpl->ctx)->seed_cur;
    }

    if (smpl->iface == &llama_sampler_mirostat_v2_i) {
        return ((const llama_sampler_mirostat_v2 *) smpl->ctx)->seed_cur;
    }

    if (smpl->iface == &llama_sampler_chain_i) {
        const auto * ctx = (const llama_sampler_chain *) smpl->ctx;
        for (auto it = ctx->samplers.rbegin(); it != ctx->samplers.rend(); ++it) {
            const uint32_t seed = llama_sampler_get_seed(*it);
            if (seed != LLAMA_DEFAULT_SEED) {
                return seed;
            }
        }
    }

    return LLAMA_DEFAULT_SEED;
}